

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dag.cpp
# Opt level: O0

void __thiscall DAGPropagator::findPathFromTo(DAGPropagator *this,int u,int v,vec<Lit> *path)

{
  bool bVar1;
  uint k;
  BoolView *this_00;
  vec<Lit> *in_RCX;
  int in_EDX;
  int in_ESI;
  long *in_RDI;
  edge_id e_1;
  bool ok;
  pair<int,_int> pair;
  int current;
  vec<Lit> path2;
  int e;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  Lit in_stack_ffffffffffffff74;
  Lit *in_stack_ffffffffffffff78;
  vec<Lit> *elem;
  vec<Lit> *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  TrailedConstantAccessList<std::pair<int,_int>,_Tint> *in_stack_ffffffffffffff98;
  pair<int,_int> local_48;
  int local_40;
  vec<Lit> local_30;
  int local_20;
  int local_1c;
  vec<Lit> *local_18;
  int local_10;
  int local_c;
  
  local_18 = in_RCX;
  local_10 = in_EDX;
  local_c = in_ESI;
  local_1c = (**(code **)(*in_RDI + 0xb8))(in_RDI,in_ESI,in_EDX);
  if (local_1c != -1) {
    GraphPropagator::getEdgeVar
              ((GraphPropagator *)CONCAT44(in_stack_ffffffffffffff74.x,in_stack_ffffffffffffff70),
               in_stack_ffffffffffffff6c);
    bVar1 = BoolView::isFixed((BoolView *)0x20befa);
    if (bVar1) {
      GraphPropagator::getEdgeVar
                ((GraphPropagator *)CONCAT44(in_stack_ffffffffffffff74.x,in_stack_ffffffffffffff70),
                 in_stack_ffffffffffffff6c);
      bVar1 = BoolView::isTrue((BoolView *)
                               CONCAT44(in_stack_ffffffffffffff74.x,in_stack_ffffffffffffff70));
      if (bVar1) {
        GraphPropagator::getEdgeVar
                  ((GraphPropagator *)
                   CONCAT44(in_stack_ffffffffffffff74.x,in_stack_ffffffffffffff70),
                   in_stack_ffffffffffffff6c);
        local_20 = (int)BoolView::getValLit((BoolView *)
                                            CONCAT44(in_stack_ffffffffffffff6c,
                                                     in_stack_ffffffffffffff68));
        vec<Lit>::push(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
        return;
      }
    }
  }
  vec<Lit>::vec(&local_30);
  k = vec<Lit>::size(local_18);
  if (k == 1) {
    vec<Lit>::push((vec<Lit> *)CONCAT44(in_stack_ffffffffffffff74.x,in_stack_ffffffffffffff70));
  }
  local_40 = local_c;
  while (local_40 != local_10) {
    std::pair<int,_int>::pair<int,_int,_true>(&local_48);
    std::vector<DAGPropagator::TrailedSuccList,_std::allocator<DAGPropagator::TrailedSuccList>_>::
    operator[]((vector<DAGPropagator::TrailedSuccList,_std::allocator<DAGPropagator::TrailedSuccList>_>
                *)(in_RDI + 0x39),(long)local_40);
    TrailedConstantAccessList<std::pair<int,_int>,_Tint>::get
              (in_stack_ffffffffffffff98,k,
               (pair<int,_int> *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    in_stack_ffffffffffffff8c = (**(code **)(*in_RDI + 0xb8))(in_RDI,local_40,local_48.second);
    elem = local_18;
    this_00 = GraphPropagator::getEdgeVar
                        ((GraphPropagator *)
                         CONCAT44(in_stack_ffffffffffffff74.x,in_stack_ffffffffffffff70),
                         in_stack_ffffffffffffff6c);
    in_stack_ffffffffffffff74 =
         BoolView::getValLit((BoolView *)
                             CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    vec<Lit>::push((vec<Lit> *)this_00,(Lit *)elem);
    local_40 = local_48.second;
  }
  vec<Lit>::~vec((vec<Lit> *)CONCAT44(in_stack_ffffffffffffff74.x,in_stack_ffffffffffffff70));
  return;
}

Assistant:

void DAGPropagator::findPathFromTo(int u, int v, vec<Lit>& path) {
	assert(u != v);
	// 1-edge paths:
	const int e = findEdge(u, v);
	if (e != -1 && getEdgeVar(e).isFixed() && getEdgeVar(e).isTrue()) {
		path.push(getEdgeVar(e).getValLit());
		return;
	}

	vec<Lit> path2;
	if (path.size() == 1) {
		path2.push();
	}

	int current = u;
	while (current != v) {
		std::pair<int, int> pair;
		const bool ok = succs[current].get(v, &pair);
		assert(ok);
		const edge_id e = findEdge(current, pair.second);
		assert(e != -1);
		assert(getEdgeVar(e).isFixed());
		assert(getEdgeVar(e).isTrue());
		path.push(getEdgeVar(e).getValLit());
		current = pair.second;
	}
	// Longer paths:
	/*
	bool found_v = false;
	stack<node_id> s;
	s.push(u);
	vector<bool> vis = vector<bool>(nbNodes(), false);
	vector<int> parent = vector<int>(nbNodes(), -1);
	parent[u] = u;
	while(!s.empty()) {
			int curr = s.top();
			s.pop();
			vis[curr] = true;
			for (int i = 0; i < ou[curr].size(); i++) {
					int e = ou[curr][i];
					if (!getEdgeVar(e).isFixed() || getEdgeVar(e).isFalse())
							continue;
					int o = getHead(e);
					if (!vis[o]) {
							s.push(o);
							parent[o] = curr;
							if (o == v) {
									found_v = true;
									break;
							}
					}
			}
			if (found_v)
					break;
			assert(!found_v);
	}
	assert(parent[v] != -1);
	assert(found_v);

	int curr = v;
	while (curr != u) {
			int e = findEdge(parent[curr],curr);
			assert(e != -1);
			assert(getEdgeVar(e).isFixed() && getEdgeVar(e).isTrue());
			//cout <<e<<" ";
			path2.push(getEdgeVar(e).getValLit());
			curr = parent[curr];
	}
	assert(path.size() == path2.size());
	*/
}